

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonparser.cpp
# Opt level: O1

bool __thiscall QJsonPrivate::Parser::parseArray(Parser *this)

{
  byte *pbVar1;
  QCborContainerPrivate *ptr;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  
  iVar2 = this->nestingLevel;
  this->nestingLevel = iVar2 + 1;
  if (iVar2 < 0x400) {
    pbVar3 = (byte *)this->json;
    pbVar1 = (byte *)this->end;
    bVar5 = pbVar3 < pbVar1;
    if ((bVar5) && (bVar4 = *pbVar3, (char)bVar4 < '!')) {
      while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
             ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
        this->json = (char *)pbVar3;
        bVar5 = pbVar3 < pbVar1;
        if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
      }
    }
    if (bVar5) {
      if (*this->json == 0x5d) {
        if (this->json < pbVar1) {
          this->json = this->json + 1;
        }
      }
      else {
        do {
          pbVar3 = (byte *)this->json;
          pbVar1 = (byte *)this->end;
          bVar5 = pbVar3 < pbVar1;
          if ((bVar5) && (bVar4 = *pbVar3, (char)bVar4 < '!')) {
            while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
                   ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
              this->json = (char *)pbVar3;
              bVar5 = pbVar3 < pbVar1;
              if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
            }
          }
          if (!bVar5) goto LAB_002f99d1;
          if ((this->container).d.ptr == (QCborContainerPrivate *)0x0) {
            ptr = (QCborContainerPrivate *)operator_new(0x40);
            (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
            _q_value.super___atomic_base<int>._M_i = 0;
            ptr->usedData = 0;
            (ptr->data).d.d = (Data *)0x0;
            (ptr->data).d.ptr = (char *)0x0;
            (ptr->data).d.size = 0;
            (ptr->elements).d.d = (Data *)0x0;
            (ptr->elements).d.ptr = (Element *)0x0;
            (ptr->elements).d.size = 0;
            QExplicitlySharedDataPointer<QCborContainerPrivate>::reset(&this->container,ptr);
          }
          bVar5 = parseValueIntoContainer(this);
          if (!bVar5) {
            return false;
          }
          pbVar3 = (byte *)this->json;
          pbVar1 = (byte *)this->end;
          bVar5 = pbVar3 < pbVar1;
          if (bVar5) {
            bVar4 = *pbVar3;
            if ((char)bVar4 < '!') {
              bVar5 = true;
              while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
                     ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
                this->json = (char *)pbVar3;
                bVar5 = pbVar3 < pbVar1;
                if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
              }
              goto LAB_002f991d;
            }
LAB_002f9922:
            pbVar3 = (byte *)this->json;
            this->json = (char *)(pbVar3 + 1);
            bVar4 = *pbVar3;
            if ((((0x3b < bVar4 - 0x22) ||
                 ((0xa00000001000401U >> ((ulong)(bVar4 - 0x22) & 0x3f) & 1) == 0)) &&
                (bVar4 != 0x7b)) && (bVar4 != 0x7d)) goto LAB_002f994b;
          }
          else {
LAB_002f991d:
            if (bVar5) goto LAB_002f9922;
LAB_002f994b:
            bVar4 = 0;
          }
          if (bVar4 == 0x2c) {
            iVar2 = 0;
          }
          else {
            iVar2 = 3;
            if (bVar4 != 0x5d) {
              pbVar3 = (byte *)this->json;
              bVar5 = pbVar3 < pbVar1;
              if ((bVar5) && (bVar4 = *pbVar3, (char)bVar4 < '!')) {
                while ((pbVar3 = pbVar3 + 1, bVar4 < 0x21 &&
                       ((0x100002600U >> ((ulong)bVar4 & 0x3f) & 1) != 0))) {
                  this->json = (char *)pbVar3;
                  bVar5 = pbVar3 < pbVar1;
                  if ((pbVar3 == pbVar1) || (bVar4 = *pbVar3, ' ' < (char)bVar4)) break;
                }
              }
              if (bVar5) {
                this->lastError = MissingValueSeparator;
              }
              else {
                this->lastError = UnterminatedArray;
              }
              iVar2 = 1;
            }
          }
        } while (iVar2 == 0);
        if (iVar2 == 1) {
          return false;
        }
      }
      this->nestingLevel = this->nestingLevel + -1;
      return true;
    }
LAB_002f99d1:
    this->lastError = UnterminatedArray;
  }
  else {
    this->lastError = DeepNesting;
  }
  return false;
}

Assistant:

bool Parser::parseArray()
{
    if (++nestingLevel > nestingLimit) {
        lastError = QJsonParseError::DeepNesting;
        return false;
    }

    if (!eatSpace()) {
        lastError = QJsonParseError::UnterminatedArray;
        return false;
    }
    if (*json == EndArray) {
        nextToken();
    } else {
        while (1) {
            if (!eatSpace()) {
                lastError = QJsonParseError::UnterminatedArray;
                return false;
            }
            if (!container)
                container = new QCborContainerPrivate;

            if (!parseValueIntoContainer())
                return false;

            char token = nextToken();
            if (token == EndArray)
                break;
            else if (token != ValueSeparator) {
                if (!eatSpace())
                    lastError = QJsonParseError::UnterminatedArray;
                else
                    lastError = QJsonParseError::MissingValueSeparator;
                return false;
            }
        }
    }

    --nestingLevel;

    return true;
}